

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O1

string * duckdb::NumericHelper::ToString<int>(string *__return_storage_ptr__,int value)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  string *__str;
  uint __val;
  uint __len;
  
  __val = -value;
  if (0 < value) {
    __val = value;
  }
  __len = 1;
  if (9 < __val) {
    uVar3 = (ulong)__val;
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar2 = (uint)uVar3;
      if (uVar2 < 100) {
        __len = __len - 2;
        goto LAB_0095e25e;
      }
      if (uVar2 < 1000) {
        __len = __len - 1;
        goto LAB_0095e25e;
      }
      if (uVar2 < 10000) goto LAB_0095e25e;
      uVar3 = uVar3 / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar2);
    __len = __len + 1;
  }
LAB_0095e25e:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct
            ((ulong)__return_storage_ptr__,(char)__len - (char)(value >> 0x1f));
  ::std::__detail::__to_chars_10_impl<unsigned_int>
            ((__return_storage_ptr__->_M_dataplus)._M_p + ((uint)value >> 0x1f),__len,__val);
  return __return_storage_ptr__;
}

Assistant:

static std::string ToString(T value) {
		return std::to_string(value);
	}